

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O2

exr_result_t LossyDctEncoder_execute(LossyDctEncoder *e)

{
  int iVar1;
  uint uVar2;
  DctCoderChannelData *pDVar3;
  uint8_t **ppuVar4;
  uint8_t *puVar5;
  uint uVar6;
  DctCoderChannelData *pDVar7;
  uint16_t uVar8;
  ushort hv;
  int i;
  int iVar9;
  ulong uVar10;
  uint8_t *ptr;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  uint16_t *puVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int x;
  uint8_t *puVar20;
  long lVar21;
  uint16_t hv_00;
  ulong uVar22;
  DctCoderChannelData *pDVar23;
  int iVar24;
  ulong uVar25;
  int i_1;
  ulong uVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  uint local_1e8;
  float srcFloat;
  uint16_t *local_1a0;
  DctCoderChannelData *chanData [3];
  uint local_148;
  uint16_t halfZigCoef [64];
  uint16_t halfCoef [64];
  
  iVar24 = e->_width;
  iVar1 = e->_channel_encode_data_count;
  uVar10 = (ulong)iVar1;
  iVar15 = e->_height;
  fVar27 = ceilf((float)iVar24 * 0.125);
  fVar28 = ceilf((float)iVar15 * 0.125);
  local_1a0 = (uint16_t *)e->_packedAc;
  e->_numAcComp = 0;
  e->_numDcComp = 0;
  iVar9 = 0;
  for (uVar12 = 0; uVar22 = (ulong)uVar12, uVar22 < uVar10; uVar12 = uVar12 + 1) {
    pDVar3 = e->_channel_encode_data[uVar22];
    chanData[uVar22] = pDVar3;
    iVar18 = 0;
    if (pDVar3->_type == EXR_PIXEL_FLOAT) {
      iVar18 = iVar15 * iVar24;
    }
    iVar9 = iVar9 + iVar18;
  }
  if (iVar9 == 0) {
    ptr = (uint8_t *)0x0;
  }
  else {
    ptr = (uint8_t *)internal_exr_alloc((long)iVar9 * 2);
    if (ptr == (uint8_t *)0x0) {
      return 1;
    }
  }
  uVar13 = (uint)fVar27;
  uVar14 = (uint)fVar28;
  puVar20 = ptr;
  for (uVar12 = 0; uVar12 < uVar10; uVar12 = uVar12 + 1) {
    pDVar3 = chanData[uVar12];
    if (pDVar3->_type == EXR_PIXEL_FLOAT) {
      uVar6 = e->_height;
      if (e->_height < 1) {
        uVar6 = 0;
      }
      for (uVar22 = 0; uVar22 != uVar6; uVar22 = uVar22 + 1) {
        ppuVar4 = pDVar3->_rows;
        puVar5 = ppuVar4[uVar22];
        uVar2 = e->_width;
        uVar25 = 0;
        if (0 < (int)uVar2) {
          uVar25 = (ulong)uVar2;
        }
        for (uVar26 = 0; uVar25 != uVar26; uVar26 = uVar26 + 1) {
          fVar27 = *(float *)(puVar5 + uVar26 * 4);
          fVar28 = 65504.0;
          if ((fVar27 <= 65504.0) && (fVar28 = fVar27, fVar27 < -65504.0)) {
            fVar28 = -65504.0;
          }
          uVar8 = float_to_half(fVar28);
          *(uint16_t *)(puVar20 + uVar26 * 2) = uVar8;
        }
        ppuVar4[uVar22] = puVar20;
        puVar20 = puVar20 + (long)(int)uVar2 * 2;
      }
    }
  }
  puVar16 = (uint16_t *)e->_packedDc;
  chanData[0]->_dc_comp = puVar16;
  for (uVar22 = 1; puVar16 = puVar16 + (int)(uVar14 * uVar13), uVar22 < uVar10; uVar22 = uVar22 + 1)
  {
    chanData[uVar22]->_dc_comp = puVar16;
  }
  uVar22 = (ulong)uVar13;
  if ((int)uVar13 < 1) {
    uVar22 = 0;
  }
  uVar25 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar25 = 0;
  }
  uVar26 = 0;
  do {
    pDVar7 = chanData[2];
    pDVar3 = chanData[1];
    if (uVar26 == uVar25) {
      if (ptr != (uint8_t *)0x0) {
        internal_exr_free(ptr);
      }
      return 0;
    }
    local_148 = (int)uVar26 * 8;
    for (uVar17 = 0; uVar17 != uVar22; uVar17 = uVar17 + 1) {
      local_1e8 = (int)uVar17 * 8;
      for (uVar19 = 0; uVar19 != uVar10; uVar19 = uVar19 + 1) {
        iVar24 = e->_width;
        iVar15 = e->_height;
        pDVar23 = chanData[uVar19];
        ppuVar4 = pDVar23->_rows;
        puVar16 = e->_toNonlinear;
        for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
          uVar13 = (uint)lVar11 | local_148;
          uVar12 = ~uVar13 + iVar15 * 2;
          if ((int)uVar13 < iVar15) {
            uVar12 = uVar13;
          }
          if ((int)uVar12 < 0) {
            uVar12 = iVar15 - 1;
          }
          puVar20 = ppuVar4[(int)uVar12];
          for (lVar21 = 0; lVar21 != 8; lVar21 = lVar21 + 1) {
            uVar13 = (uint)lVar21 | local_1e8;
            uVar12 = ~uVar13 + iVar24 * 2;
            if ((int)uVar13 < iVar24) {
              uVar12 = uVar13;
            }
            if ((int)uVar12 < 0) {
              uVar12 = iVar24 - 1;
            }
            hv = *(ushort *)(puVar20 + (long)(int)uVar12 * 2);
            if (puVar16 != (uint16_t *)0x0) {
              hv = puVar16[hv];
            }
            fVar27 = half_to_float(hv);
            pDVar23->_dctData[lVar21] = fVar27;
          }
          pDVar23 = (DctCoderChannelData *)(pDVar23->_dctData + 8);
        }
      }
      if (iVar1 == 3) {
        for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 1) {
          fVar27 = chanData[0]->_dctData[lVar11];
          fVar28 = pDVar3->_dctData[lVar11];
          fVar29 = pDVar7->_dctData[lVar11];
          chanData[0]->_dctData[lVar11] = fVar29 * 0.0722 + fVar27 * 0.2126 + fVar28 * 0.7152;
          pDVar3->_dctData[lVar11] = fVar29 * 0.5 + fVar27 * -0.1146 + fVar28 * -0.3854;
          pDVar7->_dctData[lVar11] = fVar29 * -0.0458 + fVar27 * 0.5 + fVar28 * -0.4542;
        }
      }
      lVar11 = 0x50;
      for (uVar19 = 0; uVar19 != uVar10; uVar19 = uVar19 + 1) {
        pDVar23 = chanData[uVar19];
        dctForward8x8(pDVar23->_dctData);
        for (lVar21 = 0; lVar21 != 0x40; lVar21 = lVar21 + 1) {
          fVar27 = pDVar23->_dctData[lVar21];
          fVar28 = *(float *)((long)e->_channel_encode_data + lVar21 * 4 + lVar11 + -0x20);
          uVar8 = float_to_half(fVar27);
          iVar24 = (uint)*(ushort *)(countSetBits_numBitsSet + (ulong)(uVar8 >> 8) * 2) +
                   (uint)*(ushort *)(countSetBits_numBitsSet + (ulong)(byte)uVar8 * 2);
          puVar16 = closestData + closestDataOffset[uVar8];
          do {
            hv_00 = uVar8;
            if (iVar24 < 1) break;
            iVar24 = iVar24 + -1;
            hv_00 = *puVar16;
            fVar29 = half_to_float(hv_00);
            puVar16 = puVar16 + 1;
          } while (fVar28 <= ABS(fVar29 - fVar27));
          halfCoef[lVar21] = hv_00;
        }
        puVar16 = halfZigCoef;
        for (lVar11 = 0; lVar11 != 0x100; lVar11 = lVar11 + 4) {
          *puVar16 = halfCoef[*(int *)((long)&toZigZag_remap + lVar11)];
          puVar16 = puVar16 + 1;
        }
        puVar16 = pDVar23->_dc_comp;
        pDVar23->_dc_comp = puVar16 + 1;
        *puVar16 = halfZigCoef[0];
        e->_numDcComp = e->_numDcComp + 1;
        iVar24 = 1;
        while (iVar24 < 0x40) {
          lVar11 = (long)iVar24;
          if (halfZigCoef[lVar11] == 0) {
            iVar15 = 0x40 - iVar24;
            for (lVar21 = 1; lVar11 + -0x3f + lVar21 != 1; lVar21 = lVar21 + 1) {
              if (halfZigCoef[lVar11 + lVar21] != 0) {
                if (lVar21 == 1) {
                  uVar8 = 0;
                  iVar15 = 1;
                }
                else {
                  iVar15 = (int)lVar21;
                  if (lVar11 + lVar21 == 0x40) {
                    uVar8 = 0xff00;
                  }
                  else {
                    uVar8 = (ushort)lVar21 | 0xff00;
                  }
                }
                goto LAB_0010aa65;
              }
            }
            uVar8 = (ushort)(iVar24 == 0x3f) * 0x100 - 0x100;
LAB_0010aa65:
            *local_1a0 = uVar8;
            e->_numAcComp = e->_numAcComp + 1;
            iVar24 = iVar15 + iVar24;
          }
          else {
            *local_1a0 = halfZigCoef[lVar11];
            e->_numAcComp = e->_numAcComp + 1;
            iVar24 = iVar24 + 1;
          }
          local_1a0 = local_1a0 + 1;
        }
        lVar11 = 0x150;
      }
    }
    uVar26 = uVar26 + 1;
  } while( true );
}

Assistant:

exr_result_t
LossyDctEncoder_execute (LossyDctEncoder* e)
{
    size_t               numComp = e->_channel_encode_data_count;
    DctCoderChannelData* chanData[3];

    int numBlocksX = (int) ceilf ((float) e->_width / 8.0f);
    int numBlocksY = (int) ceilf ((float) e->_height / 8.0f);

    uint16_t halfZigCoef[64];
    uint16_t halfCoef[64];

    uint16_t* currAcComp = (uint16_t*) e->_packedAc;

    e->_numAcComp = 0;
    e->_numDcComp = 0;

    //
    // Allocate a temp half buffer to quantize into for
    // any FLOAT source channels.
    //
    int tmpHalfBufferElements = 0;

    for (unsigned int chan = 0; chan < numComp; ++chan)
    {
        chanData[chan] = e->_channel_encode_data[chan];
        if (chanData[chan]->_type == EXR_PIXEL_FLOAT)
            tmpHalfBufferElements += e->_width * e->_height;
    }

    uint16_t* tmpHalfBuffer    = NULL;
    uint16_t* tmpHalfBufferPtr = NULL;
    if (tmpHalfBufferElements)
    {
        tmpHalfBuffer = (uint16_t*) internal_exr_alloc (
            tmpHalfBufferElements * sizeof (uint16_t));
        if (!tmpHalfBuffer) return EXR_ERR_OUT_OF_MEMORY;
        tmpHalfBufferPtr = tmpHalfBuffer;
    }

    //
    // Run over all the float scanlines, quantizing,
    // and re-assigning _rowPtr[y]. We need to translate
    // FLOAT XDR to HALF XDR.
    //

    for (unsigned int chan = 0; chan < numComp; ++chan)
    {
        if (chanData[chan]->_type != EXR_PIXEL_FLOAT) continue;

        for (int y = 0; y < e->_height; ++y)
        {
            const float* srcXdr = (const float*) chanData[chan]->_rows[y];

            for (int x = 0; x < e->_width; ++x)
            {
                //
                // Clamp to half ranges, instead of just casting. This
                // avoids introducing Infs which end up getting zeroed later
                //
                float src = one_to_native_float (srcXdr[x]);
                if (src > 65504.f)
                    src = 65504.f;
                else if (src < -65504.f)
                    src = -65504.f;
                tmpHalfBufferPtr[x] = one_from_native16 (float_to_half (src));
            }

            chanData[chan]->_rows[y] = (uint8_t*) tmpHalfBufferPtr;
            tmpHalfBufferPtr += e->_width;
        }
    }

    //
    // Pack DC components together by common plane, so we can get
    // a little more out of differencing them. We'll always have
    // one component per block, so we can computed offsets.
    //

    chanData[0]->_dc_comp = (uint16_t*) e->_packedDc;
    for (size_t chan = 1; chan < numComp; ++chan)
        chanData[chan]->_dc_comp =
            chanData[chan - 1]->_dc_comp + numBlocksX * numBlocksY;

    for (int blocky = 0; blocky < numBlocksY; ++blocky)
    {
        for (int blockx = 0; blockx < numBlocksX; ++blockx)
        {
            uint16_t h;

            for (size_t chan = 0; chan < numComp; ++chan)
            {
                //
                // Break the source into 8x8 blocks. If we don't
                // fit at the edges, mirror.
                //
                // Also, convert from linear to nonlinear representation.
                // Our source is assumed to be XDR, and we need to convert
                // to NATIVE prior to converting to float.
                //
                // If we're converting linear -> nonlinear, assume that the
                // XDR -> NATIVE conversion is built into the lookup. Otherwise,
                // we'll need to explicitly do it.
                //

                for (int y = 0; y < 8; ++y)
                {
                    for (int x = 0; x < 8; ++x)
                    {
                        int vx = 8 * blockx + x;
                        int vy = 8 * blocky + y;

                        if (vx >= e->_width)
                            vx = e->_width - (vx - (e->_width - 1));

                        if (vx < 0) vx = e->_width - 1;

                        if (vy >= e->_height)
                            vy = e->_height - (vy - (e->_height - 1));

                        if (vy < 0) vy = e->_height - 1;

                        h = ((const uint16_t*) (chanData[chan]->_rows)[vy])[vx];

                        if (e->_toNonlinear) { h = e->_toNonlinear[h]; }
                        else { h = one_to_native16 (h); }

                        chanData[chan]->_dctData[y * 8 + x] = half_to_float (h);
                    } // x
                }     // y
            }         // chan

            //
            // Color space conversion
            //

            if (numComp == 3)
            {
                csc709Forward64 (
                    chanData[0]->_dctData,
                    chanData[1]->_dctData,
                    chanData[2]->_dctData);
            }

            const float* quantTable = e->_quantTableY;
            for (size_t chan = 0; chan < numComp; ++chan)
            {
                //
                // Forward DCT
                //
                dctForward8x8 (chanData[chan]->_dctData);

                //
                // Quantize to half, and zigzag
                //

                for (int i = 0; i < 64; ++i)
                {
                    halfCoef[i] = quantize (
                        chanData[chan]->_dctData[i],
                        quantTable[i]);
                }

                toZigZag (halfZigCoef, halfCoef);

                //
                // Convert from NATIVE back to XDR, before we write out
                //
                priv_from_native16 (halfZigCoef, 64);

                //
                // Save the DC component separately, to be compressed on
                // its own.
                //

                *(chanData[chan]->_dc_comp)++ = halfZigCoef[0];
                e->_numDcComp++;

                //
                // Then RLE the AC components (which will record the count
                // of the resulting number of items)
                //

                LossyDctEncoder_rleAc (e, halfZigCoef, &currAcComp);
                quantTable = e->_quantTableCbCr;
            } // chan
        }     // blockx
    }         // blocky

    if (tmpHalfBuffer) internal_exr_free (tmpHalfBuffer);

    return EXR_ERR_SUCCESS;
}